

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_utils.h
# Opt level: O0

value_type
xray_re::find_by_name<std::vector<xray_re::xr_surface*,std::allocator<xray_re::xr_surface*>>>
          (vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_> *container,
          char *name)

{
  bool bVar1;
  reference ppxVar2;
  string *__lhs;
  __normal_iterator<xray_re::xr_surface_**,_std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>_>
  local_30;
  iterator end;
  iterator it;
  char *name_local;
  vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_> *container_local;
  
  end = std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>::begin(container)
  ;
  local_30._M_current =
       (xr_surface **)
       std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>::end(container);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_30);
    if (!bVar1) {
      return (value_type)0x0;
    }
    ppxVar2 = __gnu_cxx::
              __normal_iterator<xray_re::xr_surface_**,_std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>_>
              ::operator*(&end);
    __lhs = xr_surface::name_abi_cxx11_(*ppxVar2);
    bVar1 = std::operator==(__lhs,name);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<xray_re::xr_surface_**,_std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>_>
    ::operator++(&end);
  }
  ppxVar2 = __gnu_cxx::
            __normal_iterator<xray_re::xr_surface_**,_std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>_>
            ::operator*(&end);
  return *ppxVar2;
}

Assistant:

static inline
typename T::value_type find_by_name(T& container, const char* name)
{
	for (typename T::iterator it = container.begin(),
			end = container.end(); it != end; ++it) {
		if ((*it)->name() == name)
			return *it;
	}
	return 0;
}